

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

int __thiscall
asio::detail::reactive_socket_service_base::listen
          (reactive_socket_service_base *this,int __fd,int __n)

{
  undefined8 *in_RCX;
  undefined4 in_register_00000034;
  error_code *ec_local;
  int backlog_local;
  base_implementation_type *impl_local;
  reactive_socket_service_base *this_local;
  
  socket_ops::listen((socket_ops *)(ulong)*(uint *)CONCAT44(in_register_00000034,__fd),__n,
                     (int)in_RCX);
  this_local._0_4_ = (int)*in_RCX;
  return (int)this_local;
}

Assistant:

asio::error_code listen(base_implementation_type& impl,
      int backlog, asio::error_code& ec)
  {
    socket_ops::listen(impl.socket_, backlog, ec);
    return ec;
  }